

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

String * Tigre::operator+(String *__return_storage_ptr__,string *lhs,string *rhs)

{
  string sStack_38;
  
  std::__cxx11::string::append((string *)lhs);
  std::__cxx11::string::string((string *)&sStack_38,(string *)lhs);
  String::String(__return_storage_ptr__,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

Tigre::String Tigre::operator+(std::string lhs, const std::string& rhs){
    lhs += rhs;
    return lhs;
}